

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glcViewportArrayTests.cpp
# Opt level: O0

bool __thiscall
glcts::ViewportArray::DepthRange::checkResults
          (DepthRange *this,texture *texture_0,texture *param_2,GLuint param_3)

{
  byte bVar1;
  reference pvVar2;
  TestContext *this_00;
  TestLog *this_01;
  MessageBuilder *pMVar3;
  MessageBuilder local_278;
  float local_f4;
  float local_f0;
  GLfloat far;
  GLfloat near_1;
  GLfloat expected_far;
  GLfloat expected_near;
  GLuint i_1;
  GLfloat near;
  GLuint i;
  GLfloat depth_data [32];
  undefined1 local_40 [8];
  vector<float,_std::allocator<float>_> texture_data;
  bool check_result;
  GLuint param_4_local;
  texture *param_3_local;
  texture *texture_0_local;
  DepthRange *this_local;
  
  texture_data.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage._3_1_ = 1;
  texture_data.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage._4_4_ = param_3;
  std::vector<float,_std::allocator<float>_>::vector
            ((vector<float,_std::allocator<float>_> *)local_40);
  std::vector<float,_std::allocator<float>_>::resize
            ((vector<float,_std::allocator<float>_> *)local_40,0x20);
  pvVar2 = std::vector<float,_std::allocator<float>_>::operator[]
                     ((vector<float,_std::allocator<float>_> *)local_40,0);
  Utils::texture::get(texture_0,0x1903,0x1406,pvVar2);
  for (i_1 = 0; i_1 < 0x10; i_1 = i_1 + 1) {
    expected_near = (float)i_1 * 0.0625;
    (&near)[i_1 << 1] = expected_near;
    (&near)[i_1 * 2 + 1] = 1.0 - expected_near;
  }
  expected_far = 0.0;
  do {
    if (0xf < (uint)expected_far) {
LAB_01710b50:
      bVar1 = texture_data.super__Vector_base<float,_std::allocator<float>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage._3_1_;
      std::vector<float,_std::allocator<float>_>::~vector
                ((vector<float,_std::allocator<float>_> *)local_40);
      return (bool)(bVar1 & 1);
    }
    near_1 = (&near)[(uint)((int)expected_far << 1)];
    far = (&near)[(int)expected_far * 2 + 1];
    pvVar2 = std::vector<float,_std::allocator<float>_>::operator[]
                       ((vector<float,_std::allocator<float>_> *)local_40,(ulong)(uint)expected_far)
    ;
    local_f0 = *pvVar2;
    pvVar2 = std::vector<float,_std::allocator<float>_>::operator[]
                       ((vector<float,_std::allocator<float>_> *)local_40,
                        (ulong)((int)expected_far + 0x10));
    local_f4 = *pvVar2;
    if ((((near_1 != local_f0) || (NAN(near_1) || NAN(local_f0))) || (far != local_f4)) ||
       (NAN(far) || NAN(local_f4))) {
      this_00 = deqp::Context::getTestContext
                          ((this->super_DrawTestBase).super_TestCaseBase.m_context);
      this_01 = tcu::TestContext::getLog(this_00);
      tcu::TestLog::operator<<(&local_278,this_01,(BeginMessageToken *)&tcu::TestLog::Message);
      pMVar3 = tcu::MessageBuilder::operator<<(&local_278,(char (*) [19])"Invalid values at ");
      pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,(uint *)&expected_far);
      pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,(char (*) [12])0x2b8b85a);
      pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,&near_1);
      pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,(char (*) [3])0x2a4b1eb);
      pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,&far);
      pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,(char (*) [8])"] got [");
      pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,&local_f0);
      pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,(char (*) [3])0x2a4b1eb);
      pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,&local_f4);
      pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,(char (*) [2])0x29ea7ce);
      tcu::MessageBuilder::operator<<(pMVar3,(EndMessageToken *)&tcu::TestLog::EndMessage);
      tcu::MessageBuilder::~MessageBuilder(&local_278);
      texture_data.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data
      ._M_end_of_storage._3_1_ = 0;
      goto LAB_01710b50;
    }
    expected_far = (GLfloat)((int)expected_far + 1);
  } while( true );
}

Assistant:

bool DepthRange::checkResults(Utils::texture& texture_0, Utils::texture& /* texture_1 */, GLuint /*draw_call_index */)
{
	static const GLfloat step = 1.0f / 16.0f;

	bool check_result = true;

	std::vector<GLfloat> texture_data;
	texture_data.resize(m_r32f_width * m_r32f_height);
	texture_0.get(GL_RED, GL_FLOAT, &texture_data[0]);

	GLfloat depth_data[16 * 2];

	for (GLuint i = 0; i < 16; ++i)
	{
		const GLfloat near = step * (GLfloat)i;

		depth_data[i * 2 + 0] = near;
		depth_data[i * 2 + 1] = 1.0f - near;
	}

	for (GLuint i = 0; i < 16; ++i)
	{
		const GLfloat expected_near = depth_data[i * 2 + 0];
		const GLfloat expected_far  = depth_data[i * 2 + 1];

		/* Bottom row should contain near values, top one should contain far values */
		const GLfloat near = texture_data[i];
		const GLfloat far  = texture_data[i + 16];

		if ((expected_near != near) || (expected_far != far))
		{
			m_context.getTestContext().getLog() << tcu::TestLog::Message << "Invalid values at " << i << " expected ["
												<< expected_near << ", " << expected_far << "] got [" << near << ", "
												<< far << "]" << tcu::TestLog::EndMessage;

			check_result = false;
			break;
		}
	}

	return check_result;
}